

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O0

string * __thiscall
cmQtAutoGenerators::ListQt4RccInputs
          (string *__return_storage_ptr__,cmQtAutoGenerators *this,cmSourceFile *sf,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends)

{
  bool bVar1;
  string *psVar2;
  long lVar3;
  char *in_name;
  cmSourceFileLocation *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  string local_268 [32];
  undefined1 local_248 [8];
  string tag;
  RegularExpression fileReplaceRegex;
  string qrcEntry;
  size_t offset;
  char *sep;
  undefined1 local_118 [8];
  RegularExpression fileMatchRegex;
  string qrcContents;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *depends_local;
  cmSourceFile *sf_local;
  cmQtAutoGenerators *this_local;
  string *entriesList;
  
  psVar2 = cmSourceFile::GetFullPath(sf,(string *)0x0);
  ReadAll((string *)&fileMatchRegex.searchstring,psVar2);
  cmsys::RegularExpression::RegularExpression((RegularExpression *)local_118,"(<file[^<]+)");
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  offset = (long)"user=%s\x01auth=Bearer %s\x01\x01" + 0x18;
  qrcEntry.field_2._8_8_ = 0;
  while( true ) {
    lVar3 = std::__cxx11::string::c_str();
    bVar1 = cmsys::RegularExpression::find
                      ((RegularExpression *)local_118,(char *)(lVar3 + qrcEntry.field_2._8_8_));
    if (!bVar1) break;
    cmsys::RegularExpression::match_abi_cxx11_
              ((string *)&fileReplaceRegex.searchstring,(RegularExpression *)local_118,1);
    lVar3 = std::__cxx11::string::size();
    qrcEntry.field_2._8_8_ = qrcEntry.field_2._8_8_ + lVar3;
    cmsys::RegularExpression::RegularExpression
              ((RegularExpression *)((long)&tag.field_2 + 8),"(^<file[^>]*>)");
    cmsys::RegularExpression::find
              ((RegularExpression *)((long)&tag.field_2 + 8),
               (string *)&fileReplaceRegex.searchstring);
    cmsys::RegularExpression::match_abi_cxx11_
              ((string *)local_248,(RegularExpression *)((long)&tag.field_2 + 8),1);
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_268,(ulong)&fileReplaceRegex.searchstring);
    std::__cxx11::string::operator=((string *)&fileReplaceRegex.searchstring,local_268);
    std::__cxx11::string::~string(local_268);
    in_name = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::SystemTools::FileIsFullPath(in_name);
    if (!bVar1) {
      this_00 = cmSourceFile::GetLocation(sf);
      psVar2 = cmSourceFileLocation::GetDirectory_abi_cxx11_(this_00);
      std::operator+(&local_2a8,psVar2,"/");
      std::operator+(&local_288,&local_2a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &fileReplaceRegex.searchstring);
      std::__cxx11::string::operator=((string *)&fileReplaceRegex.searchstring,(string *)&local_288)
      ;
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_2a8);
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(char *)offset);
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,(string *)&fileReplaceRegex.searchstring);
    offset = (size_t)anon_var_dwarf_4e9ea8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(depends,(value_type *)&fileReplaceRegex.searchstring);
    std::__cxx11::string::~string((string *)local_248);
    cmsys::RegularExpression::~RegularExpression((RegularExpression *)((long)&tag.field_2 + 8));
    std::__cxx11::string::~string((string *)&fileReplaceRegex.searchstring);
  }
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_118);
  std::__cxx11::string::~string((string *)&fileMatchRegex.searchstring);
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGenerators::ListQt4RccInputs(cmSourceFile* sf,
                                            std::vector<std::string>& depends)
{
  const std::string qrcContents = ReadAll(sf->GetFullPath());

  cmsys::RegularExpression fileMatchRegex("(<file[^<]+)");

  std::string entriesList;
  const char* sep = "";

  size_t offset = 0;
  while (fileMatchRegex.find(qrcContents.c_str() + offset))
    {
    std::string qrcEntry = fileMatchRegex.match(1);

    offset += qrcEntry.size();

    cmsys::RegularExpression fileReplaceRegex("(^<file[^>]*>)");
    fileReplaceRegex.find(qrcEntry);
    std::string tag = fileReplaceRegex.match(1);

    qrcEntry = qrcEntry.substr(tag.size());

    if (!cmSystemTools::FileIsFullPath(qrcEntry.c_str()))
      {
      qrcEntry = sf->GetLocation().GetDirectory() + "/" + qrcEntry;
      }

    entriesList += sep;
    entriesList += qrcEntry;
    sep = "@list_sep@";
    depends.push_back(qrcEntry);
    }
  return entriesList;
}